

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IR.cpp
# Opt level: O0

PragmaInstr * IR::PragmaInstr::New(OpCode opcode,uint32 index,Func *func)

{
  JitArenaAllocator *pJVar1;
  PragmaInstr *this;
  TrackAllocData local_48;
  PragmaInstr *local_20;
  PragmaInstr *pragmaInstr;
  Func *func_local;
  uint32 index_local;
  OpCode opcode_local;
  
  pJVar1 = func->m_alloc;
  pragmaInstr = (PragmaInstr *)func;
  func_local._0_4_ = index;
  func_local._6_2_ = opcode;
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_48,(type_info *)&typeinfo,0,0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.cpp"
             ,0x810);
  pJVar1 = (JitArenaAllocator *)
           Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
           TrackAllocInfo((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)
                          pJVar1,&local_48);
  this = (PragmaInstr *)new<Memory::JitArenaAllocator>(0x60,pJVar1,0x4e98c0);
  PragmaInstr(this);
  local_20 = this;
  Instr::Init((Instr *)this,func_local._6_2_,InstrKindPragma,(Func *)pragmaInstr);
  local_20->m_statementIndex = (uint32)func_local;
  return local_20;
}

Assistant:

PragmaInstr *
PragmaInstr::New(Js::OpCode opcode, uint32 index, Func *func)
{
    PragmaInstr * pragmaInstr;

    pragmaInstr = JitAnew(func->m_alloc, IR::PragmaInstr);
    pragmaInstr->Init(opcode, InstrKindPragma, func);
    pragmaInstr->m_statementIndex = index;

    return pragmaInstr;
}